

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O2

int prov_custom_hsm_sign_with_identity
              (HSM_CLIENT_HANDLE handle,uchar *data,size_t data_len,uchar **key,size_t *key_len)

{
  undefined4 in_EAX;
  int iVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(handle == (HSM_CLIENT_HANDLE)0x0);
  auVar3._4_4_ = -(uint)(data == (uchar *)0x0);
  auVar3._8_4_ = -(uint)(key == (uchar **)0x0);
  auVar3._12_4_ = -(uint)(key_len == (size_t *)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  if (iVar1 == 0) {
    puVar2 = (uchar *)malloc(10);
    *key = puVar2;
    if (puVar2 == (uchar *)0x0) {
      puts("Failure allocating storage root key\r");
      iVar1 = 0xff;
    }
    else {
      builtin_memcpy(puVar2,"Encrypted ",10);
      *key_len = 10;
      iVar1 = 0;
    }
  }
  else {
    printf("Invalid handle value specified");
    iVar1 = 0xf2;
  }
  return iVar1;
}

Assistant:

int prov_custom_hsm_sign_with_identity(HSM_CLIENT_HANDLE handle, const unsigned char* data, size_t data_len, unsigned char** key, size_t* key_len)
{
    int result;
    if (handle == NULL || data == NULL || key == NULL || key_len == NULL)
    {
        (void)printf("Invalid handle value specified");
        result = __LINE__;
    }
    else
    {
        (void)data;
        (void)data_len;

        // TODO: Need to implement signing the data variable and malloc the key and return it to the sdk

        size_t signed_data_len = 10;
        if ((*key = (unsigned char*)malloc(signed_data_len)) == NULL)
        {
            (void)printf("Failure allocating storage root key\r\n");
            result = __LINE__;
        }
        else
        {
            memcpy(*key, ENCRYPTED_DATA, signed_data_len);
            *key_len = signed_data_len;
            result = 0;
        }
    }
    return result;
}